

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reg_alloc.cpp
# Opt level: O0

void __thiscall backend::codegen::RegAllocator::add_reg_write(RegAllocator *this,Reg reg,uint point)

{
  bool bVar1;
  pointer ppVar2;
  pointer ppVar3;
  uint in_EDX;
  unordered_map<unsigned_int,_backend::codegen::Interval,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>_>
  *in_RDI;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_int,_backend::codegen::Interval>,_false,_false>,_bool>
  pVar4;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_int,_int>,_false,_false>,_bool> pVar5;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_int,_int>,_false,_false>,_bool>
  r_use_insert;
  iterator r;
  uint in_stack_00000098;
  Reg in_stack_0000009c;
  RegAllocator *in_stack_000000a0;
  unordered_map<unsigned_int,_backend::codegen::Interval,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>_>
  *in_stack_ffffffffffffff68;
  value_type *in_stack_ffffffffffffff78;
  int local_64;
  pair<const_unsigned_int,_int> local_60;
  _Node_iterator_base<std::pair<const_unsigned_int,_int>,_false> local_58;
  undefined1 local_50;
  _Node_iterator_base<std::pair<const_unsigned_int,_backend::codegen::Interval>,_false> local_48;
  undefined1 local_40;
  Interval local_34;
  pair<const_unsigned_int,_backend::codegen::Interval> local_2c;
  _Node_iterator_base<std::pair<const_unsigned_int,_backend::codegen::Interval>,_false> local_20;
  _Node_iterator_base<std::pair<const_unsigned_int,_backend::codegen::Interval>,_false> local_18;
  uint local_10;
  uint local_c [3];
  
  local_10 = in_EDX;
  local_18._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_backend::codegen::Interval,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>_>
       ::find(in_stack_ffffffffffffff68,(key_type *)0x24418e);
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_backend::codegen::Interval,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>_>
       ::end(in_stack_ffffffffffffff68);
  bVar1 = std::__detail::operator!=(&local_18,&local_20);
  if (bVar1) {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_int,_backend::codegen::Interval>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_unsigned_int,_backend::codegen::Interval>,_false,_false>
                           *)0x2441d1);
    Interval::add_starting_point(&ppVar2->second,local_10);
  }
  else {
    in_stack_ffffffffffffff78 = (value_type *)(in_RDI + 4);
    Interval::Interval(&local_34,local_10);
    std::pair<const_unsigned_int,_backend::codegen::Interval>::
    pair<unsigned_int_&,_backend::codegen::Interval,_true>(&local_2c,local_c,&local_34);
    pVar4 = std::
            unordered_map<unsigned_int,_backend::codegen::Interval,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>_>
            ::insert(in_RDI,in_stack_ffffffffffffff78);
    local_48._M_cur =
         (__node_type *)
         pVar4.first.
         super__Node_iterator_base<std::pair<const_unsigned_int,_backend::codegen::Interval>,_false>
         ._M_cur;
    local_40 = pVar4.second;
  }
  local_64 = 1;
  std::pair<const_unsigned_int,_int>::pair<unsigned_int_&,_int,_true>(&local_60,local_c,&local_64);
  pVar5 = std::
          unordered_map<unsigned_int,_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
          ::insert((unordered_map<unsigned_int,_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
                    *)in_RDI,(value_type *)in_stack_ffffffffffffff78);
  local_58._M_cur =
       (__node_type *)
       pVar5.first.super__Node_iterator_base<std::pair<const_unsigned_int,_int>,_false>._M_cur;
  local_50 = pVar5.second;
  if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    ppVar3 = std::__detail::_Node_iterator<std::pair<const_unsigned_int,_int>,_false,_false>::
             operator->((_Node_iterator<std::pair<const_unsigned_int,_int>,_false,_false> *)0x2442a3
                       );
    ppVar3->second = ppVar3->second + 1;
  }
  add_reg_use_in_bb_at_point(in_stack_000000a0,in_stack_0000009c,in_stack_00000098);
  return;
}

Assistant:

void add_reg_write(Reg reg, unsigned int point) {
    if (auto r = live_intervals.find(reg); r != live_intervals.end()) {
      r->second.add_starting_point(point);
    } else {
      live_intervals.insert({reg, Interval(point)});
    }
    auto r_use_insert = reg_assign_count.insert({reg, 1});
    if (!r_use_insert.second) {
      r_use_insert.first->second++;
    };
    add_reg_use_in_bb_at_point(reg, point);
  }